

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.cpp
# Opt level: O1

void __thiscall
phyr::PlasticMaterial::computeScatteringFunctions
          (PlasticMaterial *this,SurfaceInteraction *si,MemoryPool *pool,TransportMode mode,
          bool allowMultipleLobes)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  ulong uVar4;
  BSDF *pBVar5;
  BxDF *pBVar6;
  undefined8 *puVar7;
  _func_int **pp_Var8;
  ulong uVar9;
  long lVar10;
  _func_int *extraout_XMM0_Qa;
  _func_int *p_Var11;
  double dVar12;
  undefined1 auVar13 [16];
  CoefficientSpectrum<60> cs_1;
  CoefficientSpectrum<60> cs;
  double local_5c8;
  double adStack_5c0 [59];
  double local_3e8;
  double adStack_3e0 [59];
  undefined1 local_208 [480];
  
  pBVar5 = (BSDF *)MemoryPool::alloc(pool,0xb0);
  BSDF::BSDF(pBVar5,si,1.0);
  si->bsdf = pBVar5;
  peVar2 = (this->Kd).
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Texture)(local_208,peVar2,si);
  lVar10 = 0;
  memset(&local_3e8,0,0x1e0);
  do {
    auVar13 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(local_208 + lVar10 * 8));
    *(undefined1 (*) [16])(adStack_3e0 + lVar10 + -1) = auVar13;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x3c);
  if ((local_3e8 == 0.0) && (!NAN(local_3e8))) {
    uVar4 = 0;
    while (uVar9 = uVar4, uVar9 != 0x3b) {
      if ((adStack_3e0[uVar9] != 0.0) || (uVar4 = uVar9 + 1, NAN(adStack_3e0[uVar9]))) break;
    }
    if (0x3a < uVar9) goto LAB_0012d4cb;
  }
  pBVar5 = si->bsdf;
  pBVar6 = (BxDF *)MemoryPool::alloc(pool,0x1f0);
  pBVar6->type = BSDF_DIFFUSE|BSDF_REFLECTION;
  pBVar6->_vptr_BxDF = (_func_int **)&PTR__BxDF_001acd58;
  memcpy(pBVar6 + 1,&local_3e8,0x1e0);
  iVar1 = pBVar5->nBxDFs;
  pBVar5->nBxDFs = iVar1 + 1;
  pBVar5->bxdfs[iVar1] = pBVar6;
LAB_0012d4cb:
  peVar2 = (this->Ks).
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Texture)(local_208,peVar2,si);
  lVar10 = 0;
  memset(&local_5c8,0,0x1e0);
  do {
    auVar13 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(local_208 + lVar10 * 8));
    *(undefined1 (*) [16])(adStack_5c0 + lVar10 + -1) = auVar13;
    lVar10 = lVar10 + 2;
  } while (lVar10 != 0x3c);
  if ((local_5c8 == 0.0) && (!NAN(local_5c8))) {
    uVar4 = 0;
    while (uVar9 = uVar4, uVar9 != 0x3b) {
      if ((adStack_5c0[uVar9] != 0.0) || (uVar4 = uVar9 + 1, NAN(adStack_5c0[uVar9]))) break;
    }
    if (0x3a < uVar9) {
      return;
    }
  }
  puVar7 = (undefined8 *)MemoryPool::alloc(pool,0x18);
  *puVar7 = &PTR_evaluate_001ad5a8;
  puVar7[1] = 0x3ff8000000000000;
  puVar7[2] = 0x3ff0000000000000;
  peVar3 = (this->roughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar3->_vptr_Texture)(peVar3,si);
  p_Var11 = extraout_XMM0_Qa;
  if (this->remapRoughness == true) {
    p_Var11 = (_func_int *)0x3f50624dd2f1a9fc;
    if (0.001 <= (double)extraout_XMM0_Qa) {
      p_Var11 = extraout_XMM0_Qa;
    }
    dVar12 = log((double)p_Var11);
    p_Var11 = (_func_int *)
              (dVar12 * 0.0006407109904102981 * dVar12 * dVar12 * dVar12 +
              dVar12 * 0.017120100557804108 * dVar12 * dVar12 +
              dVar12 * 0.17339999973773956 * dVar12 +
              dVar12 * 0.8199549913406372 + 1.6214200258255005);
  }
  pp_Var8 = (_func_int **)MemoryPool::alloc(pool,0x20);
  *(undefined1 *)(pp_Var8 + 1) = 1;
  *pp_Var8 = (_func_int *)&PTR__MicrofacetDistribution_001ad940;
  pp_Var8[2] = p_Var11;
  pp_Var8[3] = p_Var11;
  pBVar6 = (BxDF *)MemoryPool::alloc(pool,0x200);
  pBVar6->type = BSDF_GLOSSY|BSDF_REFLECTION;
  pBVar6->_vptr_BxDF = (_func_int **)&PTR__BxDF_001ad7c8;
  memcpy(pBVar6 + 1,&local_5c8,0x1e0);
  pBVar6[0x1f]._vptr_BxDF = pp_Var8;
  *(undefined8 **)&pBVar6[0x1f].type = puVar7;
  pBVar5 = si->bsdf;
  iVar1 = pBVar5->nBxDFs;
  pBVar5->nBxDFs = iVar1 + 1;
  pBVar5->bxdfs[iVar1] = pBVar6;
  return;
}

Assistant:

void PlasticMaterial::computeScatteringFunctions(SurfaceInteraction* si,
                                                 MemoryPool& pool, TransportMode mode,
                                                 bool allowMultipleLobes) const {
    si->bsdf = POOL_ALLOC(pool, BSDF)(*si);
    // Initialize diffuse component of plastic material
    Spectrum kd = Kd->evaluate(*si).clamp();
    if (!kd.isBlack())
        si->bsdf->add(POOL_ALLOC(pool, LambertianReflection)(kd));

    // Initialize specular component of plastic material
    Spectrum ks = Ks->evaluate(*si).clamp();
    if (!ks.isBlack()) {
        Fresnel* fresnel = POOL_ALLOC(pool, FresnelDielectric)(1.5f, 1.f);
        // Create microfacet distribution {distrib} for plastic material
        Real rough = roughness->evaluate(*si);
        if (remapRoughness)
            rough = TrowbridgeReitzDistribution::roughnessToAlpha(rough);
        MicrofacetDistribution *distrib =
            POOL_ALLOC(pool, TrowbridgeReitzDistribution)(rough, rough);
        BxDF* spec = POOL_ALLOC(pool, MicrofacetReflection)(ks, distrib, fresnel);
        si->bsdf->add(spec);
    }
}